

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Bundle::calculateLength(Bundle *this)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  pointer this_00;
  pointer pKVar4;
  
  this->m_ui16Length = 0;
  pKVar1 = (this->m_vStreams).
           super__Vector_base<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_vStreams).
                 super__Vector_base<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pKVar1; this_00 = this_00 + 1) {
    KVar3 = KDataStream::GetBufferSize(this_00);
    this->m_ui16Length = this->m_ui16Length + KVar3;
  }
  pKVar2 = (this->m_vRefHeaders).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vRefHeaders).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    KVar3 = Header6::GetPDULength(&pKVar4->m_pRef->super_Header6);
    this->m_ui16Length = this->m_ui16Length + KVar3;
  }
  return;
}

Assistant:

void Bundle::calculateLength()
{
    m_ui16Length = 0;

    vector<KDataStream>::const_iterator citrObj = m_vStreams.begin();
    vector<KDataStream>::const_iterator citrObjEnd = m_vStreams.end();
    for( ; citrObj != citrObjEnd; ++citrObj )
    {
        m_ui16Length += citrObj->GetBufferSize();
    }

    vector<PduPtr>::const_iterator citrRef = m_vRefHeaders.begin();
    vector<PduPtr>::const_iterator citrRefEnd = m_vRefHeaders.end();
    for( ; citrRef != citrRefEnd; ++citrRef )
    {
        m_ui16Length += ( *citrRef )->GetPDULength();
    }
}